

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkHin(ARKodeMem ark_mem,sunrealtype tout)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  ARKodeMem ark_mem_00;
  double dVar5;
  sunrealtype sVar6;
  int hgOK;
  sunrealtype yddnrm;
  sunrealtype h0;
  sunrealtype hrat;
  sunrealtype hnew;
  sunrealtype hs;
  sunrealtype hgs;
  sunrealtype hg;
  sunrealtype hub;
  sunrealtype hlb;
  sunrealtype tround;
  sunrealtype tdist;
  sunrealtype tdiff;
  int count2;
  int count1;
  int sign;
  int retval;
  sunrealtype *in_stack_ffffffffffffff38;
  ARKodeMem in_stack_ffffffffffffff40;
  ARKodeMem in_stack_ffffffffffffff48;
  ARKodeMem local_b0;
  sunrealtype in_stack_ffffffffffffff58;
  double local_88;
  double local_80;
  ARKodeMem local_70;
  ARKodeMem local_68;
  ARKodeMem local_58;
  int local_28;
  int local_24;
  int local_4;
  
  dVar4 = in_XMM0_Qa - *(double *)(in_RDI + 0x2d0);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    iVar2 = -1;
    if (0.0 < dVar4) {
      iVar2 = 1;
    }
    if (ABS(*(double *)(in_RDI + 0x2d0)) <= ABS(in_XMM0_Qa)) {
      ark_mem_00 = (ARKodeMem)((ulong)in_XMM0_Qa & 0x7fffffffffffffff);
    }
    else {
      ark_mem_00 = (ARKodeMem)((ulong)*(double *)(in_RDI + 0x2d0) & 0x7fffffffffffffff);
    }
    dVar5 = *(double *)(in_RDI + 8) * (double)ark_mem_00;
    if (dVar5 * 2.0 <= ABS(dVar4)) {
      if (*(int *)(in_RDI + 0x240) == 0) {
        iVar3 = (**(code **)(in_RDI + 0x98))
                          (*(undefined8 *)(in_RDI + 0x360),in_RDI,*(undefined8 *)(in_RDI + 0x230),
                           *(undefined8 *)(in_RDI + 0x238),0);
        if (iVar3 != 0) {
          return -8;
        }
        *(undefined4 *)(in_RDI + 0x240) = 1;
      }
      dVar5 = dVar5 * 100.0;
      sVar6 = arkUpperBoundH0(ark_mem_00,in_stack_ffffffffffffff58);
      if (0.0 < dVar5 * sVar6) {
        local_68 = (ARKodeMem)sqrt(dVar5 * sVar6);
      }
      else {
        local_68 = (ARKodeMem)0x0;
      }
      if (dVar5 <= sVar6) {
        local_58 = local_68;
        for (local_24 = 1; local_24 < 5; local_24 = local_24 + 1) {
          bVar1 = false;
          for (local_28 = 1; local_28 < 5; local_28 = local_28 + 1) {
            iVar3 = arkYddNorm(in_stack_ffffffffffffff48,(sunrealtype)in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff38);
            if (iVar3 < 0) {
              return -8;
            }
            if (iVar3 == 0) {
              bVar1 = true;
              break;
            }
            local_58 = (ARKodeMem)((double)local_58 * 0.2);
          }
          if (!bVar1) {
            if (local_24 < 3) {
              return -10;
            }
            local_70 = local_68;
            break;
          }
          local_68 = local_58;
          if (local_88 * sVar6 * sVar6 <= 2.0) {
            if (0.0 < (double)local_58 * sVar6) {
              in_stack_ffffffffffffff40 = (ARKodeMem)sqrt((double)local_58 * sVar6);
              in_stack_ffffffffffffff48 = in_stack_ffffffffffffff40;
            }
            else {
              in_stack_ffffffffffffff40 = (ARKodeMem)0x0;
              in_stack_ffffffffffffff48 = in_stack_ffffffffffffff40;
            }
          }
          else if (0.0 < 2.0 / local_88) {
            in_stack_ffffffffffffff48 = (ARKodeMem)sqrt(2.0 / local_88);
          }
          else {
            local_b0 = (ARKodeMem)0x0;
            in_stack_ffffffffffffff48 = local_b0;
          }
          local_70 = in_stack_ffffffffffffff48;
          if ((local_24 == 4) ||
             ((dVar4 = (double)in_stack_ffffffffffffff48 / (double)local_58, 0.5 < dVar4 &&
              (dVar4 < 2.0)))) break;
          if ((1 < local_24) && (2.0 < dVar4)) {
            local_70 = local_58;
            break;
          }
          local_58 = in_stack_ffffffffffffff48;
        }
        local_80 = (double)local_70 * 0.5;
        if ((double)local_70 * 0.5 < dVar5) {
          local_80 = dVar5;
        }
        if (sVar6 < local_80) {
          local_80 = sVar6;
        }
        if (iVar2 == -1) {
          local_80 = -local_80;
        }
        *(double *)(in_RDI + 0x2a0) = local_80;
        local_4 = 0;
      }
      else {
        if (iVar2 == -1) {
          *(double *)(in_RDI + 0x2a0) = -(double)local_68;
        }
        else {
          *(ARKodeMem *)(in_RDI + 0x2a0) = local_68;
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = -0x1b;
    }
  }
  else {
    local_4 = -0x1b;
  }
  return local_4;
}

Assistant:

int arkHin(ARKodeMem ark_mem, sunrealtype tout)
{
  int retval, sign, count1, count2;
  sunrealtype tdiff, tdist, tround, hlb, hub;
  sunrealtype hg, hgs, hs, hnew, hrat, h0, yddnrm;
  sunbooleantype hgOK;

  /* If tout is too close to tn, give up */
  if ((tdiff = tout - ark_mem->tcur) == ZERO) { return (ARK_TOO_CLOSE); }

  sign   = (tdiff > ZERO) ? 1 : -1;
  tdist  = SUNRabs(tdiff);
  tround = ark_mem->uround * SUNMAX(SUNRabs(ark_mem->tcur), SUNRabs(tout));

  if (tdist < TWO * tround) { return (ARK_TOO_CLOSE); }

  /* call full RHS if needed */
  if (!(ark_mem->fn_is_current))
  {
    /* NOTE: The step size (h) is used in setting the tolerance in a potential
       mass matrix solve when computing the full RHS. Before calling arkHin, h
       is set to |tout - tcur| or 1 and so we do not need to guard against
       h == 0 here before calling the full RHS. */
    retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tn, ark_mem->yn,
                                   ark_mem->fn, ARK_FULLRHS_START);
    if (retval) { return ARK_RHSFUNC_FAIL; }
    ark_mem->fn_is_current = SUNTRUE;
  }

  /* Set lower and upper bounds on h0, and take geometric mean
     as first trial value.
     Exit with this value if the bounds cross each other. */
  hlb = H0_LBFACTOR * tround;
  hub = arkUpperBoundH0(ark_mem, tdist);

  hg = SUNRsqrt(hlb * hub);

  if (hub < hlb)
  {
    if (sign == -1) { ark_mem->h = -hg; }
    else { ark_mem->h = hg; }
    return (ARK_SUCCESS);
  }

  /* Outer loop */
  hs = hg; /* safeguard against 'uninitialized variable' warning */
  for (count1 = 1; count1 <= H0_ITERS; count1++)
  {
    /* Attempts to estimate ydd */
    hgOK = SUNFALSE;

    for (count2 = 1; count2 <= H0_ITERS; count2++)
    {
      hgs    = hg * sign;
      retval = arkYddNorm(ark_mem, hgs, &yddnrm);
      /* If f() failed unrecoverably, give up */
      if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
      /* If successful, we can use ydd */
      if (retval == ARK_SUCCESS)
      {
        hgOK = SUNTRUE;
        break;
      }
      /* f() failed recoverably; cut step size and test it again */
      hg *= SUN_RCONST(0.2);
    }

    /* If f() failed recoverably H0_ITERS times */
    if (!hgOK)
    {
      /* Exit if this is the first or second pass. No recovery possible */
      if (count1 <= 2) { return (ARK_REPTD_RHSFUNC_ERR); }
      /* We have a fall-back option. The value hs is a previous hnew which
         passed through f(). Use it and break */
      hnew = hs;
      break;
    }

    /* The proposed step size is feasible. Save it. */
    hs = hg;

    /* Propose new step size */
    hnew = (yddnrm * hub * hub > TWO) ? SUNRsqrt(TWO / yddnrm)
                                      : SUNRsqrt(hg * hub);

    /* If last pass, stop now with hnew */
    if (count1 == H0_ITERS) { break; }

    hrat = hnew / hg;

    /* Accept hnew if it does not differ from hg by more than a factor of 2 */
    if ((hrat > HALF) && (hrat < TWO)) { break; }

    /* After one pass, if ydd seems to be bad, use fall-back value. */
    if ((count1 > 1) && (hrat > TWO))
    {
      hnew = hg;
      break;
    }

    /* Send this value back through f() */
    hg = hnew;
  }

  /* Apply bounds, bias factor, and attach sign */
  h0 = H0_BIAS * hnew;
  if (h0 < hlb) { h0 = hlb; }
  if (h0 > hub) { h0 = hub; }
  if (sign == -1) { h0 = -h0; }
  ark_mem->h = h0;

  return (ARK_SUCCESS);
}